

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItem.cxx
# Opt level: O0

bool operator==(cmLinkItem *l,cmLinkItem *r)

{
  __type local_19;
  cmLinkItem *r_local;
  cmLinkItem *l_local;
  
  local_19 = false;
  if (l->Target == r->Target) {
    local_19 = std::operator==(&l->String,&r->String);
  }
  return local_19;
}

Assistant:

bool operator==(cmLinkItem const& l, cmLinkItem const& r)
{
  return l.Target == r.Target && l.String == r.String;
}